

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setupTest.cpp
# Opt level: O0

void __thiscall Setup_Boundary_Test::TestBody(Setup_Boundary_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  AssertionResult *this_00;
  int sizeX;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 uVar2;
  uint in_stack_ffffffffffffff50;
  uint uVar3;
  string local_a8;
  AssertHelper local_88;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff80;
  lattice *in_stack_ffffffffffffff88;
  double **in_stack_ffffffffffffff90;
  int local_64;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_;
  int jb;
  int ib;
  double init [3];
  double **P;
  double **V;
  double **U;
  Setup_Boundary_Test *this_local;
  
  initFlags("Step",(this->super_Setup).bCond.FLAG,&(this->super_Setup).grid,
            (this->super_Setup).Region);
  gtest_ar_.message_.ptr_._4_4_ = (this->super_Setup).grid.imax / 2 - (this->super_Setup).grid.il;
  gtest_ar_.message_.ptr_._0_4_ = (this->super_Setup).grid.jmax / 2 - (this->super_Setup).grid.jb;
  if ((this->super_Setup).grid.deli < gtest_ar_.message_.ptr_._4_4_) {
    gtest_ar_.message_.ptr_._4_4_ = (this->super_Setup).grid.deli;
  }
  if ((this->super_Setup).grid.delj < (int)gtest_ar_.message_.ptr_) {
    gtest_ar_.message_.ptr_._0_4_ = (this->super_Setup).grid.delj;
  }
  local_64 = cmpFlags((this->super_Setup).bCond.FLAG,gtest_ar_.message_.ptr_._4_4_,
                      (int)gtest_ar_.message_.ptr_);
  this_00 = (AssertionResult *)local_60;
  testing::AssertionResult::AssertionResult<int>(this_00,&local_64,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  uVar2 = bVar1;
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xffffffffffffff80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)local_60,(AssertionResult *)"cmpFlags(bCond.FLAG,ib,jb)",
               "false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/MGessinger[P]NVsolver/tests/setupTest.cpp"
               ,0x4b,message);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&stack0xffffffffffffff80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    testing::Message::~Message((Message *)&stack0xffffffffffffff80);
  }
  uVar3 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  if (uVar3 == 0) {
    initUVP((double ***)(ulong)in_stack_ffffffffffffff50,(double ***)this,
            (double ***)CONCAT17(uVar2,in_stack_ffffffffffffff40),(int)((ulong)this_00 >> 0x20),
            (int)this_00,(double *)0x112257);
    setBCond((double **)0x0,(double **)0x0,&(this->super_Setup).grid,&(this->super_Setup).bCond);
    setSpecBCond((double **)CONCAT44(uVar3,in_stack_ffffffffffffff50),(double **)this,
                 (lattice *)CONCAT17(uVar2,in_stack_ffffffffffffff40),&this_00->success_);
    sizeX = (int)((ulong)this_00 >> 0x20);
    applyPbndCond(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                  (char **)in_stack_ffffffffffffff80.ptr_);
    destroy2Dfield((void **)CONCAT17(uVar2,in_stack_ffffffffffffff40),sizeX);
    destroy2Dfield((void **)CONCAT17(uVar2,in_stack_ffffffffffffff40),sizeX);
    destroy2Dfield((void **)CONCAT17(uVar2,in_stack_ffffffffffffff40),sizeX);
  }
  return;
}

Assistant:

TEST_F(Setup, Boundary)
{
	REAL **U = nullptr, **V = nullptr, **P = nullptr;
	REAL init[3] = {1.0,1.0,1.0};
	initFlags("Step",bCond.FLAG,&grid,Region);
	int ib = grid.imax/2-grid.il, jb = grid.jmax/2-grid.jb;
	if (ib > grid.deli)
		ib = grid.deli;
	if (jb > grid.delj)
		jb = grid.delj;
	ASSERT_TRUE(cmpFlags(bCond.FLAG,ib,jb));
	initUVP(&U,&V,&P,grid.imax,grid.jmax,init);

	setBCond(U,V,&grid,&bCond);
	setSpecBCond(U,V,&grid,"Step");
	applyPbndCond(P,&grid,bCond.FLAG);
/*
	print2Dfield(U,grid.deli+3,grid.delj+2);
	print2Dfield(V,grid.deli+2,grid.delj+3);
	print2Dfield(P,grid.deli+2,grid.delj+2);
*/
	destroy2Dfield((void**)U,grid.deli+3);
	destroy2Dfield((void**)V,grid.deli+2);
	destroy2Dfield((void**)P,grid.deli+2);
}